

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

ostream * operator<<(ostream *Out,TPZVec<int> *v)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  lVar1 = *(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10);
  pcVar3 = "";
  if (lVar1 == 0) {
    pcVar3 = ", ";
  }
  lVar2 = v->fNElements;
  if (lVar2 != 0) {
    *(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10) = (long)(int)lVar1;
    std::ostream::operator<<(Out,*v->fStore);
  }
  if (1 < lVar2) {
    lVar4 = 1;
    do {
      *(long *)(Out + *(long *)(*(long *)Out + -0x18) + 0x10) = (long)(int)lVar1;
      std::__ostream_insert<char,std::char_traits<char>>(Out,pcVar3,(ulong)((uint)(lVar1 == 0) * 2))
      ;
      std::ostream::operator<<(Out,v->fStore[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  return Out;
}

Assistant:

std::ostream& operator<<( std::ostream& Out, const TPZVec< T >& v )
{
	std::streamsize width = Out.width();
	
	const char* sep = ( width == 0 ? ", " : "" );
	
	int64_t size = v.NElements();
	
	if(size) Out << std::setw(width) << v.fStore[0];
	
	for( int64_t ii = 1; ii < size; ii++ )
	{
	    Out << std::setw( width ) << sep << v.fStore[ ii ];
	}
	
	return Out;
}